

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAigToLogicSopNand(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  long lVar7;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar2 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar2 != 0) {
      puts("Warning: Choice nodes are skipped.");
    }
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar2);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          if ((*(uint *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] + 0x14)
              & 0xf) == 7) {
            Abc_ObjXorFaninC(pAVar4,(int)lVar7);
          }
        }
      }
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    p = Abc_NtkDfs(pNtk,0);
    pAVar4 = Abc_AigConst1(pNtk);
    if (0 < (pAVar4->vFanouts).nSize) {
      pAVar5 = Abc_NtkCreateNodeConst1(pNtk_00);
      (pAVar4->field_6).pCopy = pAVar5;
    }
    iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
    if (iVar2 != 0) {
      pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
      (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
    }
    for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar2);
      iVar3 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
    }
    for (iVar2 = 0; iVar3 = p->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar2);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
      pcVar6 = Abc_SopCreateNand((Mem_Flex_t *)pNtk_00->pManFunc,2);
      (((pAVar4->field_6).pCopy)->field_5).pData = pcVar6;
      iVar3 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar3 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
    }
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar2);
      for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
        pvVar1 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]];
        iVar3 = Abc_ObjFaninC(pAVar4,(int)lVar7);
        pAVar5 = *(Abc_Obj_t **)((long)pvVar1 + 0x40);
        if (iVar3 != 0) {
          pAVar5 = (pAVar5->field_6).pCopy;
        }
        Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar5);
      }
      iVar3 = p->nSize;
    }
    Vec_PtrFree(p);
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar2);
      pAVar4 = *(Abc_Obj_t **)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
      if ((pAVar5->field_0x15 & 4) != 0) {
        pAVar4 = (pAVar4->field_6).pCopy;
      }
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar4);
    }
    Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar2);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          if ((*(uint *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] + 0x14)
              & 0xf) == 7) {
            Abc_ObjXorFaninC(pAVar4,(int)lVar7);
          }
        }
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      puts("Warning: The EXDc network is skipped.");
    }
    iVar2 = Abc_NtkCheck(pNtk_00);
    if (iVar2 == 0) {
      fwrite("Abc_NtkAigToLogicSopBench(): Network check has failed.\n",0x37,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                ,0x1a0,"Abc_Ntk_t *Abc_NtkAigToLogicSopNand(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSopNand( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkGetChoiceNum(pNtk) )
        printf( "Warning: Choice nodes are skipped.\n" );
    // convert complemented edges
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) )
                Abc_ObjXorFaninC( pObj, k );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // collect the nodes to be used (marks all nodes with current TravId)
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create inverters for the constant node
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
        pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // create inverters for the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    // duplicate the nodes, create node functions, and inverters
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
        pObj->pCopy->pData = Abc_SopCreateNand( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
        if ( Abc_AigNodeHasComplFanoutEdgeTrav(pObj) )
            pObj->pCopy->pCopy = Abc_NtkCreateNodeInv( pNtkNew, pObj->pCopy );
    }
    // connect the objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_ObjFaninC( pObj, k ) )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }